

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O0

void __thiscall
myvk::Buffer::UpdateData<unsigned_char*>(Buffer *this,uchar *begin,uchar *end,uint32_t byte_offset)

{
  Buffer *in_RDX;
  uchar *in_RSI;
  Buffer *in_RDI;
  uchar *in_stack_ffffffffffffffc0;
  uchar *in_stack_ffffffffffffffc8;
  uchar *in_stack_ffffffffffffffd0;
  
  if (in_RDI->m_mapped_ptr == (void *)0x0) {
    Map(in_RDX);
    std::copy<unsigned_char*,unsigned_char*>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(uchar *)in_RDX);
    Unmap(in_RDX);
  }
  else {
    GetMappedData(in_RDI);
    std::copy<unsigned_char*,unsigned_char*>((uchar *)in_RDX,in_RSI,in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

inline void UpdateData(Iter begin, Iter end, uint32_t byte_offset = 0) const {
		using T = typename std::iterator_traits<Iter>::value_type;
		if (m_mapped_ptr) {
			std::copy(begin, end, (T *)((uint8_t *)GetMappedData() + byte_offset));
		} else {
			std::copy(begin, end, (T *)((uint8_t *)Map() + byte_offset));
			Unmap();
		}
	}